

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void cfd::js::api::json::PsbtScriptData::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>_>_>,_bool>
  pVar2;
  allocator local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined1 local_208 [64];
  function<std::__cxx11::string()> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  undefined1 local_170 [64];
  function<std::__cxx11::string()> local_130 [39];
  allocator local_109;
  string local_108 [32];
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_c8 [64];
  function<std::__cxx11::string()> local_88 [32];
  undefined1 local_68 [8];
  CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> func_table;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>_>_>_>
                   *)json_mapper_abi_cxx11_);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68);
    std::function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)> *)local_c8
               ,GetAsmString_abi_cxx11_);
    std::function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::PsbtScriptData&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)> *)
               (local_c8 + 0x20),SetAsmString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_88,GetAsmFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_c8);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_c8);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [4])0x17e49e9,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68);
    local_e8 = (_Base_ptr)pVar2.first._M_node;
    local_e0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"asm",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)> *)
               local_170,GetHexString_abi_cxx11_);
    std::function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::PsbtScriptData&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)> *)
               (local_170 + 0x20),SetHexString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_130,GetHexFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_170);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_170);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [4])0x17e7d76,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68);
    local_180 = (_Base_ptr)pVar2.first._M_node;
    local_178 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"hex",&local_1a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::PsbtScriptData_const&)> *)
               local_208,GetTypeString_abi_cxx11_);
    std::function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::PsbtScriptData&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::PsbtScriptData&,UniValue_const&)> *)
               (local_208 + 0x20),SetTypeString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_1c8,GetTypeFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_208);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_208);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [5])0x17e49ff,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68);
    local_218 = (_Base_ptr)pVar2.first._M_node;
    local_210 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"type",&local_239);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_238);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::PsbtScriptData> *)local_68);
  }
  return;
}

Assistant:

void PsbtScriptData::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<PsbtScriptData> func_table;  // NOLINT

  func_table = {
    PsbtScriptData::GetAsmString,
    PsbtScriptData::SetAsmString,
    PsbtScriptData::GetAsmFieldType,
  };
  json_mapper.emplace("asm", func_table);
  item_list.push_back("asm");
  func_table = {
    PsbtScriptData::GetHexString,
    PsbtScriptData::SetHexString,
    PsbtScriptData::GetHexFieldType,
  };
  json_mapper.emplace("hex", func_table);
  item_list.push_back("hex");
  func_table = {
    PsbtScriptData::GetTypeString,
    PsbtScriptData::SetTypeString,
    PsbtScriptData::GetTypeFieldType,
  };
  json_mapper.emplace("type", func_table);
  item_list.push_back("type");
}